

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O0

void __thiscall TreeNode::removeElements(TreeNode *this)

{
  long lVar1;
  bool bVar2;
  TreeNode **ppTVar3;
  QMap<QString,_TreeNode_*> *in_RDI;
  long in_FS_OFFSET;
  ConstIterator end;
  ConstIterator it;
  TreeNode *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<QString,_TreeNode_*>::constBegin((QMap<QString,_TreeNode_*> *)in_stack_ffffffffffffffc8);
  QMap<QString,_TreeNode_*>::constEnd((QMap<QString,_TreeNode_*> *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar2 = ::operator!=((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffffc8);
    if (!bVar2) break;
    ppTVar3 = QMap<QString,_TreeNode_*>::const_iterator::operator*((const_iterator *)0x27e01d);
    (*((*ppTVar3)->super_Node)._vptr_Node[3])();
    ppTVar3 = QMap<QString,_TreeNode_*>::const_iterator::value((const_iterator *)0x27e030);
    in_stack_ffffffffffffffc8 = *ppTVar3;
    if (in_stack_ffffffffffffffc8 != (TreeNode *)0x0) {
      (*(in_stack_ffffffffffffffc8->super_Node)._vptr_Node[1])();
    }
    QMap<QString,_TreeNode_*>::const_iterator::operator++
              ((const_iterator *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  QMap<QString,_TreeNode_*>::clear(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void removeElements() override {
        ChildrenMap::ConstIterator it = children.constBegin();
        ChildrenMap::ConstIterator end = children.constEnd();
        for( ; it != end; it++) {
            (*it)->removeElements();
            delete it.value();
        }
        children.clear();
    }